

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

void Vec_IntPush(Vec_Int_t *p,int Entry)

{
  int iVar1;
  int nCapMin;
  
  iVar1 = p->nSize;
  if (iVar1 == p->nCap) {
    nCapMin = 0x10;
    if (0xf < iVar1) {
      nCapMin = iVar1 * 2;
    }
    Vec_IntGrow(p,nCapMin);
  }
  iVar1 = p->nSize;
  p->nSize = iVar1 + 1;
  p->pArray[iVar1] = Entry;
  return;
}

Assistant:

static inline void Vec_IntPush( Vec_Int_t * p, int Entry )
{
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_IntGrow( p, 16 );
        else
            Vec_IntGrow( p, 2 * p->nCap );
    }
    p->pArray[p->nSize++] = Entry;
}